

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O0

string * libtorrent::maybe_url_encode(string *__return_storage_ptr__,string *url)

{
  bool bVar1;
  int len;
  char *str;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_2;
  string_view str_00;
  array<char,_22UL> local_1de;
  libtorrent *local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [8];
  string escaped_path;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_190;
  string local_158;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined1 local_b0 [8];
  error_code ec;
  undefined1 local_98 [4];
  int port;
  string path;
  string auth;
  string host;
  string protocol;
  string *url_local;
  string *msg;
  
  std::__cxx11::string::string((string *)(host.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(auth.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_98);
  boost::system::error_code::error_code((error_code *)local_b0);
  std::__cxx11::string::string((string *)&local_158,(string *)url);
  parse_url_components(&local_138,&local_158,(error_code *)local_b0);
  __args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&auth.field_2 + 8);
  std::tie<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
            (&local_190,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&host.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&path.field_2 + 8),__args_2,(int *)((long)&ec.cat_ + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::
  tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
  ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
               *)&local_190,&local_138);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_b0);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)url);
    escaped_path.field_2._12_4_ = 1;
  }
  else {
    str = (char *)std::__cxx11::string::c_str();
    len = std::__cxx11::string::size();
    bVar1 = need_encoding(str,len);
    if (bVar1) {
      escaped_path.field_2._M_local_buf[0xb] = '\0';
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      str_00.len_ = (size_t)__args_2;
      str_00.ptr_ = local_1c0;
      escape_path_abi_cxx11_((string *)local_1b8,local_1c8,str_00);
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      if (ec.cat_._4_4_ != -1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_string(&local_1de,(long)ec.cat_._4_4_);
        std::array<char,_22UL>::data(&local_1de);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      escaped_path.field_2._M_local_buf[0xb] = '\x01';
      escaped_path.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_1b8);
      if ((escaped_path.field_2._M_local_buf[0xb] & 1U) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)url);
      escaped_path.field_2._12_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(auth.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(host.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string maybe_url_encode(std::string const& url)
	{
		std::string protocol, host, auth, path;
		int port;
		error_code ec;
		std::tie(protocol, auth, host, port, path) = parse_url_components(url, ec);
		if (ec) return url;

		// first figure out if this url contains unencoded characters
		if (!need_encoding(path.c_str(), int(path.size())))
			return url;

		std::string msg;
		std::string escaped_path { escape_path(path) };
		// reserve enough space so further append will
		// only copy values to existing location
		msg.reserve(protocol.size() + 3 + // protocol part
			auth.size() + 1 + // auth part
			host.size() + // host part
			1 + 5 + // port part
			escaped_path.size());
		msg.append(protocol);
		msg.append("://");
		if (!auth.empty())
		{
			msg.append(auth);
			msg.append("@");
		}
		msg.append(host);
		if (port != -1)
		{
			msg.append(":");
			msg.append(to_string(port).data());
		}
		msg.append(escaped_path);

		return msg;
	}